

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

unique_ptr<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_> mp::CreateFlatModelInfo(void)

{
  void *__s;
  tuple<mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_> in_RDI;
  pointer in_stack_ffffffffffffffd8;
  _Head_base<0UL,_mp::FlatModelInfo_*,_false> this;
  
  this._M_head_impl =
       (FlatModelInfo *)
       in_RDI.super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>.
       super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
  __s = operator_new(0xd0);
  memset(__s,0,0xd0);
  FlatModelInfoImpl::FlatModelInfoImpl((FlatModelInfoImpl *)this._M_head_impl);
  std::unique_ptr<mp::FlatModelInfo,std::default_delete<mp::FlatModelInfo>>::
  unique_ptr<std::default_delete<mp::FlatModelInfo>,void>
            ((unique_ptr<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>_> *)
             this._M_head_impl,in_stack_ffffffffffffffd8);
  return (__uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true>)
         (__uniq_ptr_data<mp::FlatModelInfo,_std::default_delete<mp::FlatModelInfo>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_mp::FlatModelInfo_*,_std::default_delete<mp::FlatModelInfo>_>
         .super__Head_base<0UL,_mp::FlatModelInfo_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FlatModelInfo> CreateFlatModelInfo() {
  return std::unique_ptr<FlatModelInfo>{new FlatModelInfoImpl()};
}